

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
::Matches(TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
  bVar1 = MatcherBase<solitaire::piles::PileId>::MatchAndExplain
                    ((MatcherBase<solitaire::piles::PileId> *)&this->matchers_,(PileId *)args,
                     &local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
    bVar1 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::MatchAndExplain
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>,args,
                       &local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }